

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

void __thiscall CodeGenerator::writeReplicators(CodeGenerator *this,ostream *s,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  reference pRVar4;
  Replicator *r_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Replicator,_std::allocator<Replicator>_> *__range1_1;
  Class *local_58;
  Class *instanceClass;
  _Self local_48;
  reference local_40;
  Replicator *r;
  iterator __end1;
  iterator __begin1;
  vector<Replicator,_std::allocator<Replicator>_> *__range1;
  Class *clazz_local;
  ostream *s_local;
  CodeGenerator *this_local;
  
  poVar2 = std::operator<<(s,"    // replicators");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Replicator,_std::allocator<Replicator>_>::begin(&clazz->replicators);
  r = (Replicator *)std::vector<Replicator,_std::allocator<Replicator>_>::end(&clazz->replicators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
                                *)&r);
    if (!bVar1) {
      poVar2 = std::operator<<(s,"    void initReplicators(rengine::ResourceManager *manager) {");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __end1_1 = std::vector<Replicator,_std::allocator<Replicator>_>::begin(&clazz->replicators);
      r_1 = (Replicator *)
            std::vector<Replicator,_std::allocator<Replicator>_>::end(&clazz->replicators);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
                            *)&r_1);
        if (!bVar1) break;
        pRVar4 = __gnu_cxx::
                 __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
                 ::operator*(&__end1_1);
        poVar2 = std::operator<<(s,"        ");
        poVar2 = std::operator<<(poVar2,(string *)pRVar4);
        poVar2 = std::operator<<(poVar2,".resourceManager = manager;");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"        ");
        poVar2 = std::operator<<(poVar2,(string *)pRVar4);
        poVar2 = std::operator<<(poVar2,".context = this;");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"        ");
        poVar2 = std::operator<<(poVar2,(string *)pRVar4);
        poVar2 = std::operator<<(poVar2,".setCount(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pRVar4->count).numberValue);
        poVar2 = std::operator<<(poVar2,");");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>::
        operator++(&__end1_1);
      }
      poVar2 = std::operator<<(s,"    }");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
               ::operator*(&__end1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
         ::find(&this->m_classes,&local_40->clazz);
    instanceClass =
         (Class *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                  ::end(&this->m_classes);
    bVar1 = std::operator!=(&local_48,(_Self *)&instanceClass);
    if (!bVar1) break;
    __range1_1 = (vector<Replicator,_std::allocator<Replicator>_> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                 ::find(&this->m_classes,&local_40->clazz);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
                           *)&__range1_1);
    local_58 = ppVar3->second;
    poVar2 = std::operator<<(s,"    struct Replicator_");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2," : public rengine::Replicator<");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2,"> {");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        rengine::ResourceManager *resourceManager;");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        ");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2," *context;");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        ");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2," *onCreateInstance(unsigned index, unsigned count) {");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            ");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2," *instance = new ");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2,"();");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            instance->initialize(resourceManager);");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            ");
    poVar2 = std::operator<<(poVar2,(string *)&local_40->initializor);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            context->");
    poVar2 = std::operator<<(poVar2,(string *)&local_40->parentId);
    poVar2 = std::operator<<(poVar2,"->append(instance->");
    poVar2 = std::operator<<(poVar2,(string *)&local_58->root->id);
    poVar2 = std::operator<<(poVar2,");");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            return instance;");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        }");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        void onDestroyInstance(");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2," *instance) {");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"            delete instance;");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"        }");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"    } ");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2,";");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>::
    operator++(&__end1);
  }
  __assert_fail("m_classes.find(r.clazz) != m_classes.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/src/renginec/codegenerator.h"
                ,0x185,"void CodeGenerator::writeReplicators(std::ostream &, Class *)");
}

Assistant:

void CodeGenerator::writeReplicators(std::ostream &s, Class *clazz)
{
    s << "    // replicators" << std::endl;

    // ### this only supports replecating other generated classes..
    for (const Replicator &r : clazz->replicators) {
        assert(m_classes.find(r.clazz) != m_classes.end());
        Class *instanceClass = m_classes.find(r.clazz)->second;
        s << "    struct Replicator_" << r.id << " : public rengine::Replicator<" << instanceClass->name << ", " << clazz->name << "> {" << std::endl
          << "        rengine::ResourceManager *resourceManager;" << std::endl
          << "        " << clazz->name << " *context;" << std::endl
          << "        " << instanceClass->name << " *onCreateInstance(unsigned index, unsigned count) {" << std::endl
          << "            " << instanceClass->name << " *instance = new " << instanceClass->name << "();" << std::endl
          << "            instance->initialize(resourceManager);" << std::endl
          << "            " << r.initializor << std::endl
          << "            context->" << r.parentId << "->append(instance->" << instanceClass->root->id << ");" << std::endl
          << "            return instance;" << std::endl
          << "        }" << std::endl
          << "        void onDestroyInstance(" << instanceClass->name << " *instance) {" << std::endl
          << "            delete instance;" << std::endl
          << "        }" << std::endl
          << "    } " << r.id << ";" << std::endl;
    }

    s << "    void initReplicators(rengine::ResourceManager *manager) {" << std::endl;
    for (const Replicator &r : clazz->replicators) {
        s << "        " << r.id << ".resourceManager = manager;" << std::endl
          << "        " << r.id << ".context = this;" << std::endl
          << "        " << r.id << ".setCount(" << r.count.numberValue << ");" << std::endl;
      }
    s << "    }" << std::endl;

    s << std::endl;
}